

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_ary.c
# Opt level: O0

adt_error_t adt_ary_sort(adt_ary_t *self,adt_vlt_func_t *key,_Bool reverse)

{
  _Bool reverse_local;
  adt_vlt_func_t *key_local;
  adt_ary_t *self_local;
  
  if ((self == (adt_ary_t *)0x0) || (key == (adt_vlt_func_t *)0x0)) {
    self_local._7_1_ = '\x01';
  }
  else {
    self_local._7_1_ = adt_ary_insertion_sort(self,key,reverse);
  }
  return self_local._7_1_;
}

Assistant:

adt_error_t adt_ary_sort(adt_ary_t *self, adt_vlt_func_t *key, bool reverse)
{
   if ( (self == 0) || (key == 0) )
   {
      return ADT_INVALID_ARGUMENT_ERROR;
   }
   ///TODO: For now we simply use insertion sort. Will need to implement Timsort later on.
   return adt_ary_insertion_sort(self, key, reverse);
}